

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

string * __thiscall
cmCTestSVN::LoadInfo_abi_cxx11_(string *__return_storage_ptr__,cmCTestSVN *this,SVNInfo *svninfo)

{
  undefined1 local_360 [8];
  OutputLogger err;
  InfoParser out;
  value_type local_58 [3];
  char *local_40;
  undefined1 local_38 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> svn_info;
  SVNInfo *svninfo_local;
  cmCTestSVN *this_local;
  string *rev;
  
  svn_info.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)svninfo;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
  local_40 = "info";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,&local_40);
  local_58[0] = (value_type)std::__cxx11::string::c_str();
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,local_58);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  InfoParser::InfoParser
            ((InfoParser *)&err.super_LineParser.Separator,this,"info-out> ",__return_storage_ptr__,
             (SVNInfo *)
             svn_info.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_360,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "info-err> ");
  RunSVNCommand(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,
                (OutputParser *)&err.super_LineParser.Separator,(OutputParser *)local_360);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_360);
  InfoParser::~InfoParser((InfoParser *)&err.super_LineParser.Separator);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestSVN::LoadInfo(SVNInfo& svninfo)
{
  // Run "svn info" to get the repository info from the work tree.
  std::vector<const char*> svn_info;
  svn_info.push_back("info");
  svn_info.push_back(svninfo.LocalPath.c_str());
  std::string rev;
  InfoParser out(this, "info-out> ", rev, svninfo);
  OutputLogger err(this->Log, "info-err> ");
  this->RunSVNCommand(svn_info, &out, &err);
  return rev;
}